

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
deqp::gles3::Functional::getDefaultFBDiscardAttachments
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          deUint32 discardBufferBits)

{
  uint local_24 [3];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((discardBufferBits >> 0xe & 1) != 0) {
    local_24[2] = 0x1800;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (__return_storage_ptr__,local_24 + 2);
  }
  if ((discardBufferBits >> 8 & 1) != 0) {
    local_24[1] = 0x1801;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (__return_storage_ptr__,local_24 + 1);
  }
  if ((discardBufferBits >> 10 & 1) != 0) {
    local_24[0] = 0x1802;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (__return_storage_ptr__,local_24);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<deUint32> getDefaultFBDiscardAttachments (deUint32 discardBufferBits)
{
	vector<deUint32> attachments;

	if (discardBufferBits & GL_COLOR_BUFFER_BIT)
		attachments.push_back(GL_COLOR);

	if (discardBufferBits & GL_DEPTH_BUFFER_BIT)
		attachments.push_back(GL_DEPTH);

	if (discardBufferBits & GL_STENCIL_BUFFER_BIT)
		attachments.push_back(GL_STENCIL);

	return attachments;
}